

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.cpp
# Opt level: O1

void __thiscall FIX::HttpMessage::setString(HttpMessage *this,string *string)

{
  long lVar1;
  ulong uVar2;
  mapped_type *pmVar3;
  InvalidMessage *pIVar4;
  string parameters;
  string key;
  string line;
  string value;
  string local_b8;
  key_type local_98;
  string local_78;
  Parameters *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  (this->m_root)._M_string_length = 0;
  *(this->m_root)._M_dataplus._M_p = '\0';
  local_58 = &this->m_parameters;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&local_58->_M_t);
  lVar1 = std::__cxx11::string::find((char *)string,0x1d1ff5,0);
  if (lVar1 == -1) {
    pIVar4 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    InvalidMessage::InvalidMessage(pIVar4,&local_78);
    __cxa_throw(pIVar4,&InvalidMessage::typeinfo,FIX::Exception::~Exception);
  }
  std::__cxx11::string::substr((ulong)&local_78,(ulong)string);
  lVar1 = std::__cxx11::string::find((char *)&local_78,0x1cbc3c,0);
  if (lVar1 != 0) {
    pIVar4 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
    InvalidMessage::InvalidMessage(pIVar4,&local_b8);
    __cxa_throw(pIVar4,&InvalidMessage::typeinfo,FIX::Exception::~Exception);
  }
  lVar1 = std::__cxx11::string::rfind((char *)&local_78,0x1cbc41,0xffffffffffffffff);
  if (lVar1 == -1) {
    pIVar4 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
    InvalidMessage::InvalidMessage(pIVar4,&local_b8);
    __cxa_throw(pIVar4,&InvalidMessage::typeinfo,FIX::Exception::~Exception);
  }
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_78);
  std::__cxx11::string::operator=((string *)this,(string *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  lVar1 = std::__cxx11::string::find((char)this,0x3f);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)this);
    std::__cxx11::string::substr((ulong)&local_98,(ulong)this);
    std::__cxx11::string::operator=((string *)this,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    uVar2 = 0;
    do {
      if (uVar2 == 0xffffffffffffffff) break;
      lVar1 = std::__cxx11::string::find_first_of((char *)&local_b8,0x1cc4ef,uVar2);
      if (lVar1 != -1) {
        uVar2 = std::__cxx11::string::find_first_of((char *)&local_b8,0x1cb890,uVar2 + 1);
        std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_b8);
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_b8);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_58,&local_98);
        std::__cxx11::string::_M_assign((string *)pmVar3);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
    } while (lVar1 != -1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

EXCEPT(InvalidMessage) {
  clear();

  std::string::size_type eolPos = string.find("\r\n");
  if (eolPos == std::string::npos) {
    throw InvalidMessage();
  }
  std::string line = string.substr(0, eolPos);
  std::string::size_type getPos = line.find("GET ");
  if (getPos != 0) {
    throw InvalidMessage();
  }
  std::string::size_type httpPos = line.rfind("HTTP", std::string::npos);
  if (httpPos == std::string::npos) {
    throw InvalidMessage();
  }

  m_root = line.substr(getPos + 4, httpPos - 5);
  std::string::size_type paramPos = m_root.find_first_of('?');
  if (paramPos == std::string::npos) {
    return;
  }
  std::string parameters = m_root.substr(paramPos, m_root.size() - paramPos);
  m_root = m_root.substr(0, paramPos);
  paramPos = 0;

  while (paramPos != std::string::npos) {
    std::string::size_type sepPos = parameters.find_first_of("=", paramPos);
    if (sepPos == std::string::npos) {
      break;
    }
    std::string::size_type tempPos = paramPos;
    paramPos = parameters.find_first_of("&", paramPos + 1);
    std::string key = parameters.substr(tempPos + 1, sepPos - tempPos - 1);
    std::string value = parameters.substr(sepPos + 1, paramPos - sepPos - 1);
    m_parameters[key] = value;
  }
}